

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O1

apx_error_t
apx_clientTestConnection_build_node(apx_clientTestConnection_t *self,char *definition_text)

{
  apx_error_t aVar1;
  apx_nodeManager_t *self_00;
  apx_nodeInstance_tag *node_instance;
  
  if (self == (apx_clientTestConnection_t *)0x0) {
    aVar1 = 1;
  }
  else {
    self_00 = apx_clientConnection_get_node_manager(&self->base);
    if (self_00 == (apx_nodeManager_t *)0x0) {
      aVar1 = 0x24;
    }
    else {
      aVar1 = apx_nodeManager_build_node(self_00,definition_text);
      if (aVar1 == 0) {
        node_instance = apx_nodeManager_get_last_attached(self_00);
        if (node_instance == (apx_nodeInstance_tag *)0x0) {
          __assert_fail("node_instance != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_test_connection.c"
                        ,0x17d,
                        "apx_error_t apx_clientTestConnection_build_node(apx_clientTestConnection_t *, const char *)"
                       );
        }
        apx_clientConnection_attach_node_instance(&self->base,node_instance);
      }
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_clientTestConnection_build_node(apx_clientTestConnection_t* self, char const* definition_text)
{
   if (self != NULL)
   {
      apx_nodeManager_t* node_manager = apx_clientConnection_get_node_manager(&self->base);
      if (node_manager == NULL)
      {
         return APX_NULL_PTR_ERROR;
      }
      apx_error_t retval = apx_nodeManager_build_node(node_manager, definition_text);
      if (retval == APX_NO_ERROR)
      {
         apx_nodeInstance_t* node_instance = apx_nodeManager_get_last_attached(node_manager);
         assert(node_instance != NULL);
         apx_clientConnection_attach_node_instance(&self->base, node_instance);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}